

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O0

size_t __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::cancel(deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
         *this,implementation_type *impl,error_code *ec)

{
  undefined8 *in_RDX;
  size_t in_RSI;
  per_timer_data *in_RDI;
  epoll_reactor *unaff_retaddr;
  size_t count;
  error_code *in_stack_ffffffffffffffa0;
  wait_op *this_00;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_30;
  undefined8 local_28;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_stack_fffffffffffffff8;
  size_t sVar1;
  
  if ((*(byte *)(in_RSI + 8) & 1) == 0) {
    std::error_code::error_code(in_stack_ffffffffffffffa0);
    *in_RDX = local_30;
    in_RDX[1] = local_28;
    sVar1 = 0;
  }
  else {
    this_00 = in_RDI[1].op_queue_.back_;
    std::numeric_limits<unsigned_long>::max();
    sVar1 = epoll_reactor::
            cancel_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                      (unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,in_RSI);
    *(undefined1 *)(in_RSI + 8) = 0;
    std::error_code::error_code((error_code *)this_00);
    *in_RDX = local_48;
    in_RDX[1] = local_40;
  }
  return sVar1;
}

Assistant:

std::size_t cancel(implementation_type& impl, asio::error_code& ec)
  {
    if (!impl.might_have_pending_waits)
    {
      ec = asio::error_code();
      return 0;
    }

    ASIO_HANDLER_OPERATION((scheduler_.context(),
          "deadline_timer", &impl, 0, "cancel"));

    std::size_t count = scheduler_.cancel_timer(timer_queue_, impl.timer_data);
    impl.might_have_pending_waits = false;
    ec = asio::error_code();
    return count;
  }